

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::XThreadEvent::XThreadEvent
          (XThreadEvent *this,ExceptionOrValue *result,Executor *targetExecutor,EventLoop *loop,
          void *funcTracePtr,SourceLocation location)

{
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_Event).loop = loop;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  *(undefined4 *)&(this->super_Event).location.fileName = location.fileName._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.fileName + 4) = location.fileName._4_4_;
  *(undefined4 *)&(this->super_Event).location.function = location.function._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.function + 4) = location.function._4_4_;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0061fbb8;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0061fc08;
  this->result = result;
  this->funcTracePtr = funcTracePtr;
  (**targetExecutor->_vptr_Executor)(&this->targetExecutor,targetExecutor);
  (this->targetLink).next.ptr = (XThreadEvent *)0x0;
  (this->targetLink).prev = (Maybe<kj::_::XThreadEvent_&> *)0x0;
  (this->replyExecutor).ptr = (Executor *)0x0;
  (this->promiseNode).ptr.ptr = (PromiseNode *)0x0;
  this->state = UNUSED;
  (this->replyLink).next.ptr = (XThreadEvent *)0x0;
  (this->replyLink).prev = (Maybe<kj::_::XThreadEvent_&> *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  return;
}

Assistant:

XThreadEvent::XThreadEvent(
    ExceptionOrValue& result, const Executor& targetExecutor, EventLoop& loop,
    void* funcTracePtr, SourceLocation location)
    : Event(loop, location), result(result), funcTracePtr(funcTracePtr),
      targetExecutor(targetExecutor.addRef()) {}